

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BenchmarkSuite.hpp
# Opt level: O1

void benchmarks::detail::
     BenchmarksClassRegistrar<benchmarks::MutexBenchmarks,_descriptors::mutex::std::RecursiveMutex,_descriptors::mutex::boost::Mutex,_descriptors::mutex::boost::RecursiveMutex>
     ::Register(BenchmarksMap *benchmarks)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  pointer psVar2;
  MutexBenchmarks<descriptors::mutex::std::RecursiveMutex> bm;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1a0;
  size_type local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_180;
  undefined8 local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_160;
  undefined8 local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  undefined8 *local_140;
  undefined8 local_138;
  undefined8 local_130;
  undefined8 uStack_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_120;
  size_type local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  undefined1 *local_100;
  undefined8 local_f8;
  undefined1 local_f0;
  undefined4 uStack_ef;
  undefined3 uStack_eb;
  undefined5 uStack_e8;
  undefined1 uStack_e3;
  undefined2 uStack_e2;
  pointer local_e0;
  pair<const_benchmarks::BenchmarkId,_std::shared_ptr<benchmarks::IBenchmark>_> local_d8;
  MutexBenchmarks<descriptors::mutex::std::RecursiveMutex> local_68;
  
  MutexBenchmarks<descriptors::mutex::std::RecursiveMutex>::MutexBenchmarks(&local_68);
  local_e0 = local_68.super_BenchmarksClass._benchmarks.
             super__Vector_base<std::shared_ptr<benchmarks::IBenchmark>,_std::allocator<std::shared_ptr<benchmarks::IBenchmark>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_68.super_BenchmarksClass._benchmarks.
      super__Vector_base<std::shared_ptr<benchmarks::IBenchmark>,_std::allocator<std::shared_ptr<benchmarks::IBenchmark>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_68.super_BenchmarksClass._benchmarks.
      super__Vector_base<std::shared_ptr<benchmarks::IBenchmark>,_std::allocator<std::shared_ptr<benchmarks::IBenchmark>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    psVar2 = local_68.super_BenchmarksClass._benchmarks.
             super__Vector_base<std::shared_ptr<benchmarks::IBenchmark>,_std::allocator<std::shared_ptr<benchmarks::IBenchmark>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      peVar1 = (psVar2->super___shared_ptr<benchmarks::IBenchmark,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      this = (psVar2->super___shared_ptr<benchmarks::IBenchmark,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this->_M_use_count = this->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this->_M_use_count = this->_M_use_count + 1;
        }
      }
      local_120 = &local_110;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_120,local_68.super_BenchmarksClass._name._M_dataplus._M_p,
                 local_68.super_BenchmarksClass._name._M_dataplus._M_p +
                 local_68.super_BenchmarksClass._name._M_string_length);
      (*peVar1->_vptr_IBenchmark[2])(&local_1a0,peVar1);
      local_d8.first._className._M_string_length = local_118;
      local_d8.first._benchmarkName._M_string_length = local_198;
      uStack_e8 = 0x6576697372;
      uStack_ef = 0x725f6474;
      uStack_eb = 0x756365;
      uStack_e3 = 0;
      local_180 = &local_170;
      if (local_120 == &local_110) {
        local_170._8_8_ = local_110._8_8_;
      }
      else {
        local_180 = local_120;
      }
      local_170._M_allocated_capacity._1_7_ = local_110._M_allocated_capacity._1_7_;
      local_170._M_local_buf[0] = local_110._M_local_buf[0];
      local_118 = 0;
      local_110._M_local_buf[0] = '\0';
      local_160 = &local_150;
      if (local_1a0 == &local_190) {
        local_150._8_8_ = local_190._8_8_;
      }
      else {
        local_160 = local_1a0;
      }
      local_150._M_allocated_capacity._1_7_ = local_190._M_allocated_capacity._1_7_;
      local_150._M_local_buf[0] = local_190._M_local_buf[0];
      local_198 = 0;
      local_190._M_local_buf[0] = '\0';
      local_d8.first._objectName.field_2._M_allocated_capacity = 0x756365725f647473;
      uStack_128 = CONCAT26(uStack_e2,0x6576697372);
      local_f8 = 0;
      local_f0 = 0;
      local_d8.first._className._M_dataplus._M_p = (pointer)&local_d8.first._className.field_2;
      if (local_180 == &local_170) {
        local_d8.first._className.field_2._8_8_ = local_170._8_8_;
      }
      else {
        local_d8.first._className._M_dataplus._M_p = (pointer)local_180;
      }
      local_d8.first._className.field_2._M_allocated_capacity = local_170._M_allocated_capacity;
      local_178 = 0;
      local_170._M_allocated_capacity = (ulong)(uint7)local_110._M_allocated_capacity._1_7_ << 8;
      local_d8.first._benchmarkName._M_dataplus._M_p =
           (pointer)&local_d8.first._benchmarkName.field_2;
      if (local_160 == &local_150) {
        local_d8.first._benchmarkName.field_2._8_8_ = local_150._8_8_;
      }
      else {
        local_d8.first._benchmarkName._M_dataplus._M_p = (pointer)local_160;
      }
      local_d8.first._benchmarkName.field_2._M_allocated_capacity = local_150._M_allocated_capacity;
      local_158 = 0;
      local_150._M_allocated_capacity = (ulong)(uint7)local_190._M_allocated_capacity._1_7_ << 8;
      local_d8.first._objectName._M_dataplus._M_p = (pointer)&local_d8.first._objectName.field_2;
      local_d8.first._objectName._M_string_length = 0xd;
      local_138 = 0;
      local_130 = 0x756365725f647400;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this->_M_use_count = this->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this->_M_use_count = this->_M_use_count + 1;
        }
      }
      local_1a0 = &local_190;
      local_180 = &local_170;
      local_160 = &local_150;
      local_140 = &local_130;
      local_120 = &local_110;
      local_100 = &local_f0;
      local_d8.first._objectName.field_2._8_8_ = uStack_128;
      local_d8.second.super___shared_ptr<benchmarks::IBenchmark,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = peVar1;
      local_d8.second.super___shared_ptr<benchmarks::IBenchmark,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = this;
      std::
      _Rb_tree<benchmarks::BenchmarkId,std::pair<benchmarks::BenchmarkId_const,std::shared_ptr<benchmarks::IBenchmark>>,std::_Select1st<std::pair<benchmarks::BenchmarkId_const,std::shared_ptr<benchmarks::IBenchmark>>>,std::less<benchmarks::BenchmarkId>,std::allocator<std::pair<benchmarks::BenchmarkId_const,std::shared_ptr<benchmarks::IBenchmark>>>>
      ::
      _M_insert_unique<std::pair<benchmarks::BenchmarkId_const,std::shared_ptr<benchmarks::IBenchmark>>>
                ((_Rb_tree<benchmarks::BenchmarkId,std::pair<benchmarks::BenchmarkId_const,std::shared_ptr<benchmarks::IBenchmark>>,std::_Select1st<std::pair<benchmarks::BenchmarkId_const,std::shared_ptr<benchmarks::IBenchmark>>>,std::less<benchmarks::BenchmarkId>,std::allocator<std::pair<benchmarks::BenchmarkId_const,std::shared_ptr<benchmarks::IBenchmark>>>>
                  *)benchmarks,&local_d8);
      if (local_d8.second.super___shared_ptr<benchmarks::IBenchmark,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_d8.second.
                   super___shared_ptr<benchmarks::IBenchmark,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8.first._objectName._M_dataplus._M_p != &local_d8.first._objectName.field_2) {
        operator_delete(local_d8.first._objectName._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8.first._benchmarkName._M_dataplus._M_p !=
          &local_d8.first._benchmarkName.field_2) {
        operator_delete(local_d8.first._benchmarkName._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8.first._className._M_dataplus._M_p != &local_d8.first._className.field_2) {
        operator_delete(local_d8.first._className._M_dataplus._M_p);
      }
      if (local_140 != &local_130) {
        operator_delete(local_140);
      }
      if (local_160 != &local_150) {
        operator_delete(local_160);
      }
      if (local_180 != &local_170) {
        operator_delete(local_180);
      }
      if (local_100 != &local_f0) {
        operator_delete(local_100);
      }
      if (local_1a0 != &local_190) {
        operator_delete(local_1a0);
      }
      if (local_120 != &local_110) {
        operator_delete(local_120);
      }
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      psVar2 = psVar2 + 1;
    } while (psVar2 != local_e0);
  }
  BenchmarksClassRegistrar<benchmarks::MutexBenchmarks,_descriptors::mutex::boost::Mutex,_descriptors::mutex::boost::RecursiveMutex>
  ::Register(benchmarks);
  std::
  vector<std::shared_ptr<benchmarks::IBenchmark>,_std::allocator<std::shared_ptr<benchmarks::IBenchmark>_>_>
  ::~vector(&local_68.super_BenchmarksClass._benchmarks);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.super_BenchmarksClass._name._M_dataplus._M_p !=
      &local_68.super_BenchmarksClass._name.field_2) {
    operator_delete(local_68.super_BenchmarksClass._name._M_dataplus._M_p);
  }
  return;
}

Assistant:

static void Register(BenchmarksMap& benchmarks)
			{
				BenchmarksClass_<ObjectsDescHead_> bm;
				for (auto b : bm.GetBenchmarks())
					benchmarks.insert({BenchmarkId(bm.GetName(), b->GetName(), ObjectsDescHead_::GetName()), b});

				BenchmarksClassRegistrar<BenchmarksClass_, ObjectsDescTail_...>::Register(benchmarks);
			}